

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O0

void av1_update_temporal_layer_framerate(AV1_COMP *cpi)

{
  LAYER_CONTEXT *pLVar1;
  int iVar2;
  LAYER_CONTEXT *pLVar3;
  AV1_COMP *in_RDI;
  double dVar4;
  int64_t prev_layer_target_bandwidth;
  double prev_layer_framerate;
  LAYER_CONTEXT *lcprev;
  int prev_layer;
  int tl;
  RATE_CONTROL *lrc;
  LAYER_CONTEXT *lc;
  SVC *svc;
  
  pLVar3 = get_layer_context(in_RDI);
  iVar2 = (in_RDI->svc).temporal_layer_id;
  pLVar3->framerate = in_RDI->framerate / (double)pLVar3->framerate_factor;
  dVar4 = round((double)pLVar3->target_bandwidth / pLVar3->framerate);
  (pLVar3->rc).avg_frame_bandwidth = (int)dVar4;
  (pLVar3->rc).max_frame_bandwidth = (in_RDI->rc).max_frame_bandwidth;
  if (iVar2 == 0) {
    pLVar3->avg_frame_size = (pLVar3->rc).avg_frame_bandwidth;
  }
  else {
    iVar2 = (in_RDI->svc).spatial_layer_id * (in_RDI->svc).number_temporal_layers +
            (in_RDI->svc).temporal_layer_id + -1;
    pLVar1 = (in_RDI->svc).layer_context;
    dVar4 = in_RDI->framerate / (double)pLVar1[iVar2].framerate_factor;
    if (pLVar3->framerate <= dVar4) {
      dVar4 = round((double)pLVar3->target_bandwidth / pLVar3->framerate);
      pLVar3->avg_frame_size = (int)dVar4;
    }
    else {
      dVar4 = round((double)(pLVar3->target_bandwidth - pLVar1[iVar2].layer_target_bitrate) /
                    (pLVar3->framerate - dVar4));
      pLVar3->avg_frame_size = (int)dVar4;
    }
  }
  return;
}

Assistant:

void av1_update_temporal_layer_framerate(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  LAYER_CONTEXT *const lc = get_layer_context(cpi);
  RATE_CONTROL *const lrc = &lc->rc;
  const int tl = svc->temporal_layer_id;
  lc->framerate = cpi->framerate / lc->framerate_factor;
  lrc->avg_frame_bandwidth = (int)round(lc->target_bandwidth / lc->framerate);
  lrc->max_frame_bandwidth = cpi->rc.max_frame_bandwidth;
  // Update the average layer frame size (non-cumulative per-frame-bw).
  if (tl == 0) {
    lc->avg_frame_size = lrc->avg_frame_bandwidth;
  } else {
    int prev_layer = svc->spatial_layer_id * svc->number_temporal_layers +
                     svc->temporal_layer_id - 1;
    LAYER_CONTEXT *const lcprev = &svc->layer_context[prev_layer];
    const double prev_layer_framerate =
        cpi->framerate / lcprev->framerate_factor;
    const int64_t prev_layer_target_bandwidth = lcprev->layer_target_bitrate;
    if (lc->framerate > prev_layer_framerate) {
      lc->avg_frame_size =
          (int)round((lc->target_bandwidth - prev_layer_target_bandwidth) /
                     (lc->framerate - prev_layer_framerate));
    } else {
      lc->avg_frame_size = (int)round(lc->target_bandwidth / lc->framerate);
    }
  }
}